

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O2

int __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeScaleExp(SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *vec,DataArray<int> *oldScaleExp)

{
  Real eps;
  bool bVar1;
  fpclass_type fVar2;
  int32_t iVar3;
  bool bVar4;
  type_conflict5 tVar5;
  int iVar6;
  int *piVar7;
  undefined7 extraout_var;
  long lVar8;
  long lVar9;
  long lVar10;
  int *piVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *a;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *p_Var12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  double *pdVar14;
  soplex *psVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar16;
  long lVar17;
  byte bVar18;
  int scaleExp;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxi;
  undefined1 local_3a8 [112];
  int local_338;
  bool local_334;
  fpclass_type local_330;
  int32_t local_32c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_328;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2a8;
  soplex local_228 [112];
  int local_1b8;
  undefined1 local_1b4;
  undefined8 local_1b0;
  double local_1a8 [14];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  soplex local_b0 [128];
  
  bVar18 = 0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&maxi.m_backend,0.0,(type *)0x0);
  lVar8 = 0x80;
  for (lVar17 = 0; lVar17 < vec->memused; lVar17 = lVar17 + 1) {
    piVar7 = (int *)((long)(vec->m_elem->val).m_backend.data._M_elems + lVar8);
    lVar10 = 0x1c;
    piVar11 = piVar7 + -0x20;
    psVar15 = local_228;
    for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
      *(int *)psVar15 = *piVar11;
      piVar11 = piVar11 + (ulong)bVar18 * -2 + 1;
      psVar15 = psVar15 + (ulong)bVar18 * -8 + 4;
    }
    local_1b8 = piVar7[-4];
    local_1b4 = (undefined1)piVar7[-3];
    local_1b0 = *(undefined8 *)(piVar7 + -2);
    spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                *)local_b0,local_228,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)(ulong)(uint)oldScaleExp->data[*piVar7],(int)oldScaleExp->data);
    spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)1>>
              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                *)local_3a8,local_b0,a);
    iVar3 = local_32c;
    fVar2 = local_330;
    bVar1 = local_334;
    iVar6 = local_338;
    p_Var12 = (__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_3a8;
    pdVar14 = local_1a8;
    for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
      *(uint *)pdVar14 = *(uint *)&p_Var12->_M_ptr;
      p_Var12 = (__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)
                ((long)p_Var12 + (ulong)bVar18 * -8 + 4);
      pdVar14 = (double *)((long)pdVar14 + ((ulong)bVar18 * -2 + 1) * 4);
    }
    pdVar14 = local_1a8;
    pnVar13 = &local_328;
    for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pnVar13->m_backend).data._M_elems[0] = *(uint *)pdVar14;
      pdVar14 = (double *)((long)pdVar14 + ((ulong)bVar18 * -2 + 1) * 4);
      pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar13 + ((ulong)bVar18 * -2 + 1) * 4);
    }
    local_328.m_backend.exp = local_338;
    local_328.m_backend.neg = local_334;
    local_328.m_backend.fpclass = local_330;
    local_328.m_backend.prec_elem = local_32c;
    pnVar13 = &maxi;
    pnVar16 = &local_2a8;
    for (; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pnVar16->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
      pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar13 + ((ulong)bVar18 * -2 + 1) * 4);
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar18 * -2 + 1) * 4);
    }
    local_2a8.m_backend.exp = maxi.m_backend.exp;
    local_2a8.m_backend.neg = maxi.m_backend.neg;
    local_2a8.m_backend.prec_elem = maxi.m_backend.prec_elem;
    local_2a8.m_backend.fpclass = maxi.m_backend.fpclass;
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_3a8,
               &(this->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    eps = Tolerances::epsilon((Tolerances *)local_3a8._0_8_);
    bVar4 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_328,&local_2a8,eps);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3a8 + 8));
    if (bVar4) {
      pdVar14 = local_1a8;
      pnVar13 = &maxi;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pnVar13->m_backend).data._M_elems[0] = *(uint *)pdVar14;
        pdVar14 = (double *)((long)pdVar14 + ((ulong)bVar18 * -2 + 1) * 4);
        pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar13 + ((ulong)bVar18 * -2 + 1) * 4);
      }
      maxi.m_backend.exp = iVar6;
      maxi.m_backend.neg = bVar1;
      maxi.m_backend.fpclass = fVar2;
      maxi.m_backend.prec_elem = iVar3;
    }
    lVar8 = lVar8 + 0x84;
  }
  local_3a8._0_8_ = (element_type *)0x0;
  tVar5 = boost::multiprecision::operator==(&maxi,(double *)local_3a8);
  piVar11 = (int *)(CONCAT71(extraout_var,tVar5) & 0xffffffff);
  iVar6 = 0;
  if ((char)piVar11 == '\0') {
    local_1a8[0] = 1.0;
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 0x1c;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems[6] = 0;
    result.m_backend.data._M_elems[7] = 0;
    result.m_backend.data._M_elems[8] = 0;
    result.m_backend.data._M_elems[9] = 0;
    result.m_backend.data._M_elems[10] = 0;
    result.m_backend.data._M_elems[0xb] = 0;
    result.m_backend.data._M_elems[0xc] = 0;
    result.m_backend.data._M_elems[0xd] = 0;
    result.m_backend.data._M_elems[0xe] = 0;
    result.m_backend.data._M_elems[0xf] = 0;
    result.m_backend.data._M_elems[0x10] = 0;
    result.m_backend.data._M_elems[0x11] = 0;
    result.m_backend.data._M_elems[0x12] = 0;
    result.m_backend.data._M_elems[0x13] = 0;
    result.m_backend.data._M_elems[0x14] = 0;
    result.m_backend.data._M_elems[0x15] = 0;
    result.m_backend.data._M_elems[0x16] = 0;
    result.m_backend.data._M_elems[0x17] = 0;
    result.m_backend.data._M_elems[0x18] = 0;
    result.m_backend.data._M_elems[0x19] = 0;
    result.m_backend.data._M_elems._104_5_ = 0;
    result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result.m_backend.exp = 0;
    result.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
              (&result.m_backend,local_1a8,&maxi.m_backend);
    boost::multiprecision::
    frexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
              ((type *)local_3a8,(multiprecision *)&result.m_backend,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&scaleExp,piVar11);
    iVar6 = scaleExp + -1;
  }
  return iVar6;
}

Assistant:

int SPxScaler<R>::computeScaleExp(const SVectorBase<R>& vec,
                                  const DataArray<int>& oldScaleExp) const
{
   R maxi = 0.0;

   // find largest absolute value after applying existing scaling factors
   for(int i = 0; i < vec.size(); ++i)
   {
      R x = spxAbs(spxLdexp(vec.value(i), oldScaleExp[vec.index(i)]));

      if(GT(x, maxi, this->tolerances()->epsilon()))
         maxi = x;
   }

   // empty rows/cols are possible
   if(maxi == 0.0)
      return 0;
   // get exponent corresponding to new scaling factor
   else
   {
      int scaleExp;
      spxFrexp(R(1.0 / maxi), &(scaleExp));
      return scaleExp - 1;
   }
}